

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_ptest(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_ptr arg1;
  TCGv_i32 arg3;
  TCGv_i32 arg2;
  TCGv_i32 is_read;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((((s->base).tb)->flags & 0x2000) == 0) {
    gen_exception(s,(s->base).pc_next,8);
  }
  else {
    arg3 = tcg_const_i32_m68k(tcg_ctx_00,(int)(uint)insn >> 5 & 1);
    arg1 = tcg_ctx_00->cpu_env;
    arg2 = get_areg(s,insn & 7);
    gen_helper_ptest(tcg_ctx_00,arg1,arg2,arg3);
    tcg_temp_free_i32(tcg_ctx_00,arg3);
  }
  return;
}

Assistant:

DISAS_INSN(ptest)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv is_read;

    if (IS_USER(s)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }
    is_read = tcg_const_i32(tcg_ctx, (insn >> 5) & 1);
    gen_helper_ptest(tcg_ctx, tcg_ctx->cpu_env, AREG(insn, 0), is_read);
    tcg_temp_free(tcg_ctx, is_read);
}